

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readandsynthesis.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int fft_size_00;
  int fs_00;
  int iVar9;
  ulong uVar10;
  double *f0_00;
  double *temporal_positions_00;
  double **spectrogram_00;
  double **aperiodicity_00;
  double *pdVar11;
  double dVar12;
  int local_134;
  int i_1;
  double *y;
  int y_length;
  int number_of_dimensions;
  int i;
  double **aperiodicity;
  double **spectrogram;
  double *temporal_positions;
  double *f0;
  char filename [200];
  double frame_period;
  int fs;
  int fft_size;
  int f0_length;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    argv_local._4_4_ = 0;
  }
  else {
    iVar8 = strcmp(argv[1],"-h");
    if (iVar8 == 0) {
      anon_unknown.dwarf_1ee::usage(*argv);
      argv_local._4_4_ = -1;
    }
    else {
      dVar12 = GetHeaderInformation(argv[1],"NOF ");
      iVar8 = (int)dVar12;
      dVar12 = GetHeaderInformation(argv[2],"FFT ");
      fft_size_00 = (int)dVar12;
      dVar12 = GetHeaderInformation(argv[2],"FS  ");
      fs_00 = (int)dVar12;
      filename._192_8_ = GetHeaderInformation(argv[2],"FP  ");
      memcpy(&f0,"output.wav",200);
      iVar9 = anon_unknown.dwarf_1ee::SetOption(argc,argv,(char *)&f0);
      if (iVar9 == 0) {
        argv_local._4_4_ = 0;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)iVar8;
        uVar10 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        f0_00 = (double *)operator_new__(uVar10);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)iVar8;
        uVar10 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        temporal_positions_00 = (double *)operator_new__(uVar10);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (long)iVar8;
        uVar10 = SUB168(auVar3 * ZEXT816(8),0);
        if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        spectrogram_00 = (double **)operator_new__(uVar10);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (long)iVar8;
        uVar10 = SUB168(auVar4 * ZEXT816(8),0);
        if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        aperiodicity_00 = (double **)operator_new__(uVar10);
        for (y_length = 0; y_length < iVar8; y_length = y_length + 1) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (long)(fft_size_00 / 2 + 1);
          uVar10 = SUB168(auVar5 * ZEXT816(8),0);
          if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
            uVar10 = 0xffffffffffffffff;
          }
          pdVar11 = (double *)operator_new__(uVar10);
          spectrogram_00[y_length] = pdVar11;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (long)(fft_size_00 / 2 + 1);
          uVar10 = SUB168(auVar6 * ZEXT816(8),0);
          if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
            uVar10 = 0xffffffffffffffff;
          }
          pdVar11 = (double *)operator_new__(uVar10);
          aperiodicity_00[y_length] = pdVar11;
        }
        ReadF0(argv[1],temporal_positions_00,f0_00);
        dVar12 = GetHeaderInformation(argv[2],"NOD ");
        if ((int)dVar12 == 0) {
          ReadSpectralEnvelope(argv[2],spectrogram_00);
        }
        else {
          anon_unknown.dwarf_1ee::ReadCodedSpectralEnvelope
                    (argv[2],iVar8,fs_00,fft_size_00,(int)dVar12,spectrogram_00);
        }
        dVar12 = GetHeaderInformation(argv[3],"NOD ");
        if ((int)dVar12 == 0) {
          ReadAperiodicity(argv[3],aperiodicity_00);
        }
        else {
          anon_unknown.dwarf_1ee::ReadCodedAperiodicity
                    (argv[3],iVar8,fs_00,fft_size_00,(int)dVar12,aperiodicity_00);
        }
        iVar9 = (int)((((double)iVar8 * (double)filename._192_8_) / 1000.0) * (double)fs_00);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (long)iVar9;
        uVar10 = SUB168(auVar7 * ZEXT816(8),0);
        if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        pdVar11 = (double *)operator_new__(uVar10);
        Synthesis(f0_00,iVar8,spectrogram_00,aperiodicity_00,fft_size_00,(double)filename._192_8_,
                  fs_00,iVar9,pdVar11);
        wavwrite(pdVar11,iVar9,fs_00,0x10,(char *)&f0);
        if (pdVar11 != (double *)0x0) {
          operator_delete__(pdVar11);
        }
        for (local_134 = 0; local_134 < iVar8; local_134 = local_134 + 1) {
          if (spectrogram_00[local_134] != (double *)0x0) {
            operator_delete__(spectrogram_00[local_134]);
          }
          if (aperiodicity_00[local_134] != (double *)0x0) {
            operator_delete__(aperiodicity_00[local_134]);
          }
        }
        if (spectrogram_00 != (double **)0x0) {
          operator_delete__(spectrogram_00);
        }
        if (aperiodicity_00 != (double **)0x0) {
          operator_delete__(aperiodicity_00);
        }
        if (f0_00 != (double *)0x0) {
          operator_delete__(f0_00);
        }
        if (temporal_positions_00 != (double *)0x0) {
          operator_delete__(temporal_positions_00);
        }
        argv_local._4_4_ = 0;
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  // Command check
  if (argc < 2) return 0;
  if (0 == strcmp(argv[1], "-h")) {
    usage(argv[0]);
    return -1;
  }

  // Get parameters required for memory allocation
  int f0_length = static_cast<int>(GetHeaderInformation(argv[1], "NOF "));
  int fft_size = static_cast<int>(GetHeaderInformation(argv[2], "FFT "));
  int fs = static_cast<int>(GetHeaderInformation(argv[2], "FS  "));
  double frame_period = GetHeaderInformation(argv[2], "FP  ");
  char filename[200] = "output.wav";

  // Option from command line
  if (SetOption(argc, argv, filename) == 0) return 0;

  // Memory allocation
  double *f0 = new double[f0_length];
  double *temporal_positions = new double[f0_length];
  double **spectrogram = new double *[f0_length];
  double **aperiodicity = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i) {
    spectrogram[i] = new double[fft_size / 2 + 1];
    aperiodicity[i] = new double[fft_size / 2 + 1];
  }

  // Read F0
  ReadF0(argv[1], temporal_positions, f0);

  // Read spectral envelope
  int number_of_dimensions =
    static_cast<int>(GetHeaderInformation(argv[2], "NOD "));
  if (number_of_dimensions == 0) {
    // If the spectral envelope is not coded.
    ReadSpectralEnvelope(argv[2], spectrogram);
  } else {
    // If the spectral envelope is coded.
    ReadCodedSpectralEnvelope(argv[2], f0_length, fs, fft_size,
      number_of_dimensions, spectrogram);
  }

  // Read aperiodicity
  number_of_dimensions =
    static_cast<int>(GetHeaderInformation(argv[3], "NOD "));
  if (number_of_dimensions == 0) {
    // If the aperiodicity is not coded.
    ReadAperiodicity(argv[3], aperiodicity);
  } else {
    // If the aperiodicity is coded.
    ReadCodedAperiodicity(argv[3], f0_length, fs, fft_size,
        number_of_dimensions, aperiodicity);
  }

  // Synthesis
  int y_length = static_cast<int>(f0_length * frame_period / 1000.0 * fs);
  double *y = new double[y_length];
  Synthesis(f0, f0_length, spectrogram, aperiodicity, fft_size, frame_period,
      fs, y_length, y);

  // File output
  wavwrite(y, y_length, fs, 16, filename);

  // Memory deallocation
  delete[] y;
  for (int i = 0; i < f0_length; ++i) {
    delete[] spectrogram[i];
    delete[] aperiodicity[i];
  }
  delete[] spectrogram;
  delete[] aperiodicity;
  delete[] f0;
  delete[] temporal_positions;
  return 0;
}